

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestFailure.cpp
# Opt level: O1

void __thiscall
FeatureUnsupportedFailure::FeatureUnsupportedFailure
          (FeatureUnsupportedFailure *this,UtestShell *test,char *fileName,size_t lineNumber,
          SimpleString *featureName,SimpleString *text)

{
  SimpleString *this_00;
  char *pcVar1;
  
  TestFailure::TestFailure(&this->super_TestFailure,test,fileName,lineNumber);
  (this->super_TestFailure)._vptr_TestFailure = (_func_int **)&PTR__TestFailure_003a7cf8;
  TestFailure::createUserText((TestFailure *)&stack0xffffffffffffffd8,(SimpleString *)test);
  this_00 = &(this->super_TestFailure).message_;
  SimpleString::operator=(this_00,(SimpleString *)&stack0xffffffffffffffd8);
  SimpleString::~SimpleString((SimpleString *)&stack0xffffffffffffffd8);
  pcVar1 = SimpleString::asCharString(featureName);
  StringFromFormat(&stack0xffffffffffffffd8,
                   "The feature \"%s\" is not supported in this environment or with the feature set selected when building the library."
                   ,pcVar1);
  SimpleString::operator+=(this_00,(SimpleString *)&stack0xffffffffffffffd8);
  SimpleString::~SimpleString((SimpleString *)&stack0xffffffffffffffd8);
  return;
}

Assistant:

FeatureUnsupportedFailure::FeatureUnsupportedFailure(UtestShell* test, const char* fileName, size_t lineNumber,
                                                     const SimpleString& featureName, const SimpleString& text)
: TestFailure(test, fileName, lineNumber)
{
    message_ = createUserText(text);

    message_ += StringFromFormat("The feature \"%s\" is not supported in this environment or with the feature set selected when building the library.", featureName.asCharString());
}